

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

Test * ParserTestMultipleOutputs::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x1e8);
  ParserTestMultipleOutputs((ParserTestMultipleOutputs *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(ParserTest, MultipleOutputs) {
  State local_state;
  ManifestParser parser(&local_state, NULL);
  string err;
  EXPECT_TRUE(parser.ParseTest("rule cc\n  command = foo\n  depfile = bar\n"
                               "build a.o b.o: cc c.cc\n",
                               &err));
  EXPECT_EQ("", err);
}